

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::ReturnValueVerifier::operator()
          (ReturnValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ostringstream *this_00;
  ostringstream *this_01;
  long lVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  char *__s;
  undefined8 *puVar5;
  int *piVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ConstPixelBufferAccess *__n;
  void *__buf;
  Vector<int,_2> (*arr) [5];
  int (*arr_00) [5];
  Vector<int,_3> (*arr_01) [5];
  int (*arr_02) [5];
  int (*arr_03) [5];
  int i;
  long lVar9;
  int iVar10;
  int iVar11;
  size_type *psVar12;
  ulong uVar13;
  int x;
  uint uVar14;
  int compareArgs [5];
  int z;
  IVec2 pixelCoords [5];
  int returnValues [5];
  IVec3 invocationGlobalIDs [5];
  allocator<char> local_7c1;
  TextureFormat local_7c0;
  ChannelOrder local_7b8 [5];
  undefined1 local_7a4 [4];
  int local_7a0;
  int local_79c;
  long *local_798 [2];
  long local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  ConstPixelBufferAccess *local_770;
  long *local_768 [2];
  long local_758 [2];
  ChannelOrder local_748 [8];
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  undefined8 uStack_668;
  undefined4 uStack_660;
  undefined4 local_65c;
  undefined4 uStack_658;
  undefined8 uStack_654;
  ReturnValueVerifier *local_640;
  long local_638;
  undefined1 local_630 [8];
  undefined1 local_628 [112];
  ios_base local_5b8 [264];
  undefined1 local_4b0 [8];
  _func_int **local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0 [6];
  ios_base local_438 [264];
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300 [4];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  local_7c0 = (TextureFormat)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
  std::ostream::operator<<((ostringstream *)local_630,sliceOrFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
  std::ios_base::~ios_base((ios_base *)(local_628 + 0x68));
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x1c598fb);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar8) {
    local_4a0[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_4a0[0]._8_8_ = plVar4[3];
    local_4b0 = (undefined1  [8])local_4a0;
  }
  else {
    local_4a0[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_4b0 = (undefined1  [8])*plVar4;
  }
  local_4a8 = (_func_int **)plVar4[1];
  *plVar4 = (long)paVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    __s = glu::getCubeMapFaceName
                    ((&DAT_01c58824)
                     [(int)(&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces
                           )[sliceOrFaceNdx]]);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_768,__s,&local_7c1);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_768,0,(char *)0x0,0x1cc1766);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
    std::ostream::operator<<(local_630,sliceOrFaceNdx);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
    std::ios_base::~ios_base((ios_base *)(local_628 + 0x68));
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_768,0,(char *)0x0,0x1c59337);
  }
  local_798[0] = &local_788;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_788 = *plVar4;
    uStack_780 = puVar5[3];
  }
  else {
    local_788 = *plVar4;
    local_798[0] = (long *)*puVar5;
  }
  local_798[1] = (long *)puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_798,0,(char *)0x0,0x1c59908);
  psVar12 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_688.field_2._M_allocated_capacity = *psVar12;
    local_688.field_2._8_8_ = plVar4[3];
    local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  }
  else {
    local_688.field_2._M_allocated_capacity = *psVar12;
    local_688._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_688._M_string_length = plVar4[1];
  *plVar4 = (long)psVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __n = resultSlice;
  tcu::LogImage::LogImage
            ((LogImage *)local_330,(string *)local_4b0,&local_688,resultSlice,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_330,local_7c0.order,__buf,(size_t)__n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_p != local_300) {
    operator_delete(local_310._M_p,local_300[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._0_8_ != &local_320) {
    operator_delete((void *)local_330._0_8_,local_320._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if (local_798[0] != &local_788) {
    operator_delete(local_798[0],local_788 + 1);
  }
  if (local_768[0] != local_758) {
    operator_delete(local_768[0],local_758[0] + 1);
  }
  if (local_4b0 != (undefined1  [8])local_4a0) {
    operator_delete((void *)local_4b0,local_4a0[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
  iVar7 = (resultSlice->m_size).m_data[1];
  if (0 < iVar7) {
    iVar2 = sliceOrFaceNdx * sliceOrFaceNdx;
    iVar10 = this->m_endResultImageWidth;
    local_638 = 0;
    local_7a0 = iVar2;
    local_79c = sliceOrFaceNdx;
    local_770 = resultSlice;
    local_640 = this;
    do {
      if (0 < iVar10) {
        uVar13 = local_638 << 0x20;
        iVar7 = (int)local_638;
        iVar11 = 0;
        do {
          psVar12 = &local_688._M_string_length;
          uStack_658 = 0;
          uStack_654 = 0;
          uStack_668 = 0;
          uStack_660 = 0;
          local_65c = 0;
          local_688.field_2._M_allocated_capacity = 0;
          local_688.field_2._8_8_ = 0;
          local_688._M_dataplus._M_p = (pointer)0x0;
          local_688._M_string_length = 0;
          local_788 = 0;
          uStack_780 = 0;
          local_798[0] = (long *)0x0;
          local_798[1] = (long *)0x0;
          local_778 = 0;
          lVar9 = 0;
          do {
            lVar1 = local_638;
            uVar14 = (int)lVar9 * iVar10 + iVar11;
            local_798[lVar9] = (long *)(uVar13 | uVar14);
            *(uint *)&(((string *)(psVar12 + -1))->_M_dataplus)._M_p = uVar14;
            *(int *)((long)psVar12 + -4) = (int)lVar1;
            *(int *)psVar12 = local_79c;
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_630,(int)local_770,uVar14,(int)lVar1);
            local_748[lVar9] = local_630._0_4_;
            iVar10 = local_640->m_endResultImageWidth;
            local_7b8[lVar9] =
                 ((int)uVar14 / iVar10) * 0x2a +
                 ((int)uVar14 % iVar10) * ((int)uVar14 % iVar10) + iVar7 * iVar7 + iVar2;
            lVar9 = lVar9 + 1;
            psVar12 = (size_type *)((long)psVar12 + 0xc);
          } while (lVar9 != 5);
          lVar9 = 0;
          iVar3 = 0;
          this_00 = (ostringstream *)(local_330 + 8);
          do {
            if ((local_748[lVar9] != local_7b8[iVar3]) &&
               ((lVar9 == 0 || (iVar3 = iVar3 + 1, local_748[lVar9] != local_7b8[iVar3])))) {
              local_1b0._0_4_ = local_7c0.order;
              local_1b0._4_4_ = local_7c0.type;
              this_01 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(this_01);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_01,"// Failure: intermediate return values at pixels ",0x31
                        );
              arrayStr<tcu::Vector<int,2>,5>(&local_6a8,(Functional *)local_798,arr);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_01,local_6a8._M_dataplus._M_p,local_6a8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_01," of current layer are ",0x16);
              arrayStr<int,5>(&local_6c8,(Functional *)local_748,arr_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_01,local_6c8._M_dataplus._M_p,local_6c8._M_string_length);
              local_4b0 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_1b0,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_4a8,"// Note: relevant shader invocation global IDs are "
                         ,0x33);
              arrayStr<tcu::Vector<int,3>,5>(&local_6e8,(Functional *)&local_688,arr_01);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_4a8,local_6e8._M_dataplus._M_p,local_6e8._M_string_length
                        );
              local_330._0_8_ =
                   tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_4b0,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"// Note: \'compare\' argument values for the IDs are ",
                         0x33);
              arrayStr<int,5>(&local_708,(Functional *)local_7b8,arr_02);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,local_708._M_dataplus._M_p,local_708._M_string_length);
              local_630 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_330,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_628,
                         "// Note: expected the return value sequence to fulfill the following conditions:\n"
                         ,0x51);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_628,"// - first value is ",0x14);
              std::ostream::operator<<((ostream *)local_628,local_7b8[0]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_628,
                         "// - each value other than the first is either the same as the one just before it, or the smallest value (in the sequence "
                         ,0x7a);
              arrayStr<int,5>(&local_728,(Functional *)local_7b8,arr_03);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_628,local_728._M_dataplus._M_p,local_728._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_628,") bigger than the one just before it",0x24);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_728._M_dataplus._M_p != &local_728.field_2) {
                operator_delete(local_728._M_dataplus._M_p,
                                local_728.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
              std::ios_base::~ios_base(local_5b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_708._M_dataplus._M_p != &local_708.field_2) {
                operator_delete(local_708._M_dataplus._M_p,
                                local_708.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_2b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
                operator_delete(local_6e8._M_dataplus._M_p,
                                local_6e8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4a8);
              std::ios_base::~ios_base(local_438);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
                operator_delete(local_6c8._M_dataplus._M_p,
                                local_6c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
                operator_delete(local_6a8._M_dataplus._M_p,
                                local_6a8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream(this_01);
              std::ios_base::~ios_base(local_138);
              if (lVar9 == 0) {
                local_630._0_4_ = local_7c0.order;
                local_630._4_4_ = local_7c0.type;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_628,"// Note: the first return value (",0x21);
                std::ostream::operator<<((ostringstream *)local_628,local_748[0]);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_628,") isn\'t ",8);
                std::ostream::operator<<((ostringstream *)local_628,local_7b8[0]);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
              }
              else {
                local_630._0_4_ = local_7c0.order;
                local_630._4_4_ = local_7c0.type;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_628,"// Note: the return value at index ",0x23);
                std::ostream::operator<<((ostringstream *)local_628,(int)lVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_628," (value ",8);
                std::ostream::operator<<((ostringstream *)local_628,local_748[lVar9]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,") ",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_628,"is neither ",0xb);
                uVar14 = (int)lVar9 - 1;
                std::ostream::operator<<((ostringstream *)local_628,local_748[uVar14]);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_628," (the one just before it) ",0x1a);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"nor ",4);
                piVar6 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                   (local_7b8,local_7a4,local_748 + uVar14);
                std::ostream::operator<<
                          ((ostringstream *)local_628,
                           local_7b8[((long)piVar6 - (long)local_7b8) * 0x40000000 + 0x100000000 >>
                                     0x20]);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_628,
                           " (the smallest value bigger than the one just before it)",0x38);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
              std::ios_base::~ios_base(local_5b8);
              return false;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 5);
          iVar11 = iVar11 + 1;
        } while (iVar11 < iVar10);
        iVar7 = (local_770->m_size).m_data[1];
        iVar2 = local_7a0;
      }
      local_638 = local_638 + 1;
    } while (local_638 < iVar7);
  }
  return true;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		DE_ASSERT(isFormatTypeInteger(resultSlice.getFormat().type));
		DE_ASSERT(resultSlice.getWidth() == NUM_INVOCATIONS_PER_PIXEL*m_endResultImageWidth);

		log << TestLog::Image("ReturnValues" + toString(sliceOrFaceNdx),
							  "Per-Invocation Return Values, "
								   + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																	  : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < m_endResultImageWidth; x++)
		{
			// Get the atomic function args and return values for all the invocations that contribute to the pixel (x, y) in the current end result slice.

			int		returnValues[NUM_INVOCATIONS_PER_PIXEL];
			int		compareArgs[NUM_INVOCATIONS_PER_PIXEL];
			IVec3	invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			IVec2	pixelCoords[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec2 pixCoord	(x + i*m_endResultImageWidth, y);
				const IVec3 gid			(pixCoord.x(), pixCoord.y(), sliceOrFaceNdx);

				pixelCoords[i]			= pixCoord;
				invocationGlobalIDs[i]	= gid;
				returnValues[i]			= resultSlice.getPixelInt(gid.x(), y).x();
				compareArgs[i]			= getCompareArg(gid, m_endResultImageWidth);
			}

			// Verify that the return values form a valid sequence.
			// Due to the way the compare and assign arguments to the atomic calls are organized
			// among the different invocations contributing to the same pixel -- i.e. one invocation
			// compares to A and assigns B, another compares to B and assigns C, and so on, where
			// A<B<C etc -- the first value in the return value sequence must be A, and each following
			// value must be either the same as or the smallest value (among A, B, C, ...) bigger than
			// the one just before it. E.g. sequences A A A A A A A A, A B C D E F G H and
			// A A B B B C D E are all valid sequences (if there were 8 invocations contributing
			// to each pixel).

			{
				int failingNdx = -1;

				{
					int currentAtomicValueNdx = 0;
					for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
					{
						if (returnValues[i] == compareArgs[currentAtomicValueNdx])
							continue;
						if (i > 0 && returnValues[i] == compareArgs[currentAtomicValueNdx+1])
						{
							currentAtomicValueNdx++;
							continue;
						}
						failingNdx = i;
						break;
					}
				}

				if (failingNdx >= 0)
				{
					log << TestLog::Message << "// Failure: intermediate return values at pixels " << arrayStr(pixelCoords) << " of current layer are "
											<< arrayStr(returnValues) << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: 'compare' argument values for the IDs are " << arrayStr(compareArgs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: expected the return value sequence to fulfill the following conditions:\n"
											<< "// - first value is " << compareArgs[0] << "\n"
											<< "// - each value other than the first is either the same as the one just before it, or the smallest value (in the sequence "
											<< arrayStr(compareArgs) << ") bigger than the one just before it" << TestLog::EndMessage;
					if (failingNdx == 0)
						log << TestLog::Message << "// Note: the first return value (" << returnValues[0] << ") isn't " << compareArgs[0] << TestLog::EndMessage;
					else
						log << TestLog::Message << "// Note: the return value at index " << failingNdx << " (value " << returnValues[failingNdx] << ") "
												<< "is neither " << returnValues[failingNdx-1] << " (the one just before it) "
												<< "nor " << compareArgs[arrayIndexOf(compareArgs, returnValues[failingNdx-1])+1] << " (the smallest value bigger than the one just before it)"
												<< TestLog::EndMessage;

					return false;
				}
			}
		}

		return true;
	}